

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::resetIndex(QGraphicsSceneBspTreeIndexPrivate *this)

{
  parameter_type t;
  qsizetype qVar1;
  const_reference ppQVar2;
  QGraphicsItemPrivate *pQVar3;
  QList<QGraphicsItem_*> *in_RDI;
  int in_stack_0000000c;
  QGraphicsItem *item;
  int i;
  QGraphicsSceneBspTreeIndexPrivate *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar4;
  
  purgeRemovedItems((QGraphicsSceneBspTreeIndexPrivate *)
                    CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  iVar4 = 0;
  while( true ) {
    t = (parameter_type)(long)iVar4;
    qVar1 = QList<QGraphicsItem_*>::size(in_RDI + 0xb);
    if (qVar1 <= (long)t) break;
    ppQVar2 = QList<QGraphicsItem_*>::at(in_RDI,(qsizetype)t);
    in_stack_ffffffffffffffe8 = (QGraphicsSceneBspTreeIndexPrivate *)*ppQVar2;
    if (in_stack_ffffffffffffffe8 != (QGraphicsSceneBspTreeIndexPrivate *)0x0) {
      pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                           *)&(in_stack_ffffffffffffffe8->super_QGraphicsSceneIndexPrivate).
                              field_0x8);
      pQVar3->index = -1;
      QList<QGraphicsItem_*>::operator<<(in_RDI,t);
    }
    iVar4 = iVar4 + 1;
  }
  QList<QGraphicsItem_*>::clear(in_RDI);
  QList<int>::clear((QList<int> *)in_RDI);
  QList<QGraphicsItem_*>::clear(in_RDI);
  *(undefined1 *)((long)&in_RDI[10].d.size + 1) = 1;
  startIndexTimer(in_stack_ffffffffffffffe8,in_stack_0000000c);
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::resetIndex()
{
    purgeRemovedItems();
    for (int i = 0; i < indexedItems.size(); ++i) {
        if (QGraphicsItem *item = indexedItems.at(i)) {
            item->d_ptr->index = -1;
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            unindexedItems << item;
        }
    }
    indexedItems.clear();
    freeItemIndexes.clear();
    untransformableItems.clear();
    regenerateIndex = true;
    startIndexTimer();
}